

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.c
# Opt level: O0

void mempool_stats(mempool *pool,mempool_stats *stats)

{
  uint32_t uVar1;
  size_t sVar2;
  intptr_t iVar3;
  mempool_stats *stats_local;
  mempool *pool_local;
  
  stats->objsize = pool->objsize;
  sVar2 = mempool_count(pool);
  stats->objcount = (uint32_t)sVar2;
  iVar3 = slab_order_size(pool->cache,pool->slab_order);
  stats->slabsize = (uint32_t)iVar3;
  stats->slabcount = (uint32_t)((pool->slabs).stats.total / (ulong)stats->slabsize);
  (stats->totals).used = (pool->slabs).stats.used;
  sVar2 = (pool->slabs).stats.total;
  uVar1 = mslab_sizeof();
  (stats->totals).total = sVar2 - uVar1 * stats->slabcount;
  return;
}

Assistant:

void
mempool_stats(struct mempool *pool, struct mempool_stats *stats)
{
	/* Object size. */
	stats->objsize = pool->objsize;
	/* Number of objects. */
	stats->objcount = mempool_count(pool);
	/* Size of the slab. */
	stats->slabsize = slab_order_size(pool->cache, pool->slab_order);
	/* The number of slabs. */
	stats->slabcount = pool->slabs.stats.total/stats->slabsize;
	/* How much memory is used for slabs. */
	stats->totals.used = pool->slabs.stats.used;
	/*
	 * How much memory is available. Subtract the slab size,
	 * which is allocation overhead and is not available
	 * memory.
	 */
	stats->totals.total = pool->slabs.stats.total -
		mslab_sizeof() * stats->slabcount;
}